

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O1

void hash_print_usage(char *executable)

{
  hash_params default_params;
  
  putchar(10);
  printf("usage: %s [options] GGUF_IN\n",executable);
  putchar(10);
  printf("Hash a GGUF file");
  putchar(10);
  puts("options:");
  puts("  -h, --help              show this help message and exit");
  puts("      --xxh64             use xxh64 hash");
  puts("      --sha1              use sha1 hash");
  puts("      --sha256            use sha256 hash");
  puts("      --all               use all hash");
  puts("      --no-layer          exclude per layer hash");
  puts("      --uuid              generate UUIDv5 ID");
  puts("  -c, --check <manifest>  verify against a manifest");
  putchar(10);
  return;
}

Assistant:

static void hash_print_usage(const char * executable) {
    const hash_params default_params;
    printf("\n");
    printf("usage: %s [options] GGUF_IN\n", executable);
    printf("\n");
    printf("Hash a GGUF file");
    printf("\n");
    printf("options:\n");
    printf("  -h, --help              show this help message and exit\n");
    printf("      --xxh64             use xxh64 hash\n");
    printf("      --sha1              use sha1 hash\n");
    printf("      --sha256            use sha256 hash\n");
    printf("      --all               use all hash\n");
    printf("      --no-layer          exclude per layer hash\n");
    printf("      --uuid              generate UUIDv5 ID\n");
    printf("  -c, --check <manifest>  verify against a manifest\n");
    printf("\n");
}